

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDLImporter::InternReadFile_Quake1(MDLImporter *this)

{
  aiFace *paVar1;
  uint uVar2;
  int iVar3;
  Header *pcHeader;
  aiMesh *paVar4;
  aiVector3D *paVar5;
  ulong *puVar6;
  aiFace *paVar7;
  aiNode *this_00;
  uint *puVar8;
  aiMesh **ppaVar9;
  Logger *this_01;
  runtime_error *this_02;
  ulong uVar10;
  uint uVar11;
  ai_real aVar12;
  ai_real *paVar13;
  ulong uVar14;
  ai_real *paVar15;
  ulong uVar16;
  uint c;
  Header *pHVar17;
  long lVar18;
  ulong uVar19;
  float fVar20;
  uint iSkip;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (this->pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x159,"void Assimp::MDLImporter::InternReadFile_Quake1()");
  }
  pcHeader = (Header *)this->mBuffer;
  ValidateHeader_Quake1(this,pcHeader);
  pHVar17 = pcHeader + 1;
  if (pcHeader->num_skins != 0) {
    uVar11 = 0;
    do {
      if (this->mBuffer + this->iFileSize < pHVar17->scale + 1) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"[Quake 1 MDL] Unexpected EOF","");
        std::runtime_error::runtime_error(this_02,(string *)local_50);
        *(undefined ***)this_02 = &PTR__runtime_error_00896c98;
        __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (pHVar17->ident == 1) {
        uVar2 = pHVar17->version;
        pHVar17 = (Header *)pHVar17->scale;
        if ((ulong)uVar2 != 0) {
          if (uVar11 == 0) {
            CreateTextureARGB8_3DGS_MDL3(this,(uchar *)((long)pHVar17 + (ulong)uVar2 * 4));
          }
          pHVar17 = (Header *)
                    ((long)((long)pHVar17 + (ulong)uVar2 * 4) +
                    (long)pcHeader->skinwidth * (long)pcHeader->skinheight);
        }
      }
      else {
        local_50[0] = (undefined1 *)CONCAT44(local_50[0]._4_4_,-(uint)(uVar11 != 0));
        CreateTexture_3DGS_MDL4(this,(uchar *)&pHVar17->version,pHVar17->ident,(uint *)local_50);
        pHVar17 = (Header *)(((ulong)local_50[0] & 0xffffffff) + (long)&pHVar17->version);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (uint)pcHeader->num_skins);
  }
  paVar13 = pHVar17->scale + (long)pcHeader->num_verts * 3 + -2;
  iVar3 = pcHeader->num_tris;
  paVar15 = paVar13 + (long)iVar3 * 4;
  SizeCheck(this,paVar15,
            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
            ,0x192);
  if (paVar13[(long)iVar3 * 4] == 0.0) {
    paVar15 = paVar15 + 1;
  }
  else {
    paVar15 = *(ai_real **)(paVar15 + 5);
  }
  SizeCheck(this,paVar15 + (long)pcHeader->num_verts + 6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
            ,0x1a1);
  SetupMaterialProperties_3DGS_MDL5_Quake1(this);
  paVar4 = (aiMesh *)operator_new(0x520);
  paVar4->mPrimitiveTypes = 0;
  paVar4->mNumVertices = 0;
  paVar4->mNumFaces = 0;
  memset(&paVar4->mVertices,0,0xcc);
  paVar4->mBones = (aiBone **)0x0;
  paVar4->mMaterialIndex = 0;
  (paVar4->mName).length = 0;
  (paVar4->mName).data[0] = '\0';
  memset((paVar4->mName).data + 1,0x1b,0x3ff);
  paVar4->mNumAnimMeshes = 0;
  paVar4->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar4->mMethod = 0;
  (paVar4->mAABB).mMin.x = 0.0;
  (paVar4->mAABB).mMin.y = 0.0;
  (paVar4->mAABB).mMin.z = 0.0;
  (paVar4->mAABB).mMax.x = 0.0;
  (paVar4->mAABB).mMax.y = 0.0;
  (paVar4->mAABB).mMax.z = 0.0;
  paVar4->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar4->mNumUVComponents[0] = 0;
  paVar4->mNumUVComponents[1] = 0;
  paVar4->mNumUVComponents[2] = 0;
  paVar4->mNumUVComponents[3] = 0;
  paVar4->mNumUVComponents[4] = 0;
  paVar4->mNumUVComponents[5] = 0;
  paVar4->mNumUVComponents[6] = 0;
  paVar4->mNumUVComponents[7] = 0;
  paVar4->mColors[0] = (aiColor4D *)0x0;
  paVar4->mColors[1] = (aiColor4D *)0x0;
  paVar4->mColors[2] = (aiColor4D *)0x0;
  paVar4->mColors[3] = (aiColor4D *)0x0;
  paVar4->mColors[4] = (aiColor4D *)0x0;
  paVar4->mColors[5] = (aiColor4D *)0x0;
  paVar4->mColors[6] = (aiColor4D *)0x0;
  paVar4->mColors[7] = (aiColor4D *)0x0;
  paVar4->mPrimitiveTypes = 4;
  iVar3 = pcHeader->num_tris;
  uVar11 = iVar3 * 3;
  paVar4->mNumVertices = uVar11;
  paVar4->mNumFaces = pcHeader->num_tris;
  paVar5 = (aiVector3D *)operator_new__((ulong)uVar11 * 0xc);
  if (iVar3 != 0) {
    memset(paVar5,0,(((ulong)uVar11 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar4->mVertices = paVar5;
  uVar11 = paVar4->mNumVertices;
  paVar5 = (aiVector3D *)operator_new__((ulong)uVar11 * 0xc);
  if (uVar11 != 0) {
    memset(paVar5,0,(((ulong)uVar11 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar4->mTextureCoords[0] = paVar5;
  uVar16 = (ulong)paVar4->mNumFaces;
  puVar6 = (ulong *)operator_new__(uVar16 * 0x10 + 8);
  paVar1 = (aiFace *)(puVar6 + 1);
  *puVar6 = uVar16;
  if (uVar16 != 0) {
    paVar7 = paVar1;
    do {
      paVar7->mNumIndices = 0;
      paVar7->mIndices = (uint *)0x0;
      paVar7 = paVar7 + 1;
    } while (paVar7 != paVar1 + uVar16);
  }
  paVar4->mFaces = paVar1;
  uVar11 = paVar4->mNumVertices;
  paVar5 = (aiVector3D *)operator_new__((ulong)uVar11 * 0xc);
  if (uVar11 != 0) {
    memset(paVar5,0,(((ulong)uVar11 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar4->mNormals = paVar5;
  paVar4->mNumUVComponents[0] = 2;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  this->pScene->mRootNode = this_00;
  this->pScene->mRootNode->mNumMeshes = 1;
  puVar8 = (uint *)operator_new__(4);
  this->pScene->mRootNode->mMeshes = puVar8;
  *this->pScene->mRootNode->mMeshes = 0;
  this->pScene->mNumMeshes = 1;
  ppaVar9 = (aiMesh **)operator_new__(8);
  this->pScene->mMeshes = ppaVar9;
  *this->pScene->mMeshes = paVar4;
  if (pcHeader->num_tris != 0) {
    uVar19 = 0;
    uVar16 = 0;
    do {
      puVar8 = (uint *)operator_new__(0xc);
      paVar4->mFaces[uVar19].mIndices = puVar8;
      paVar4->mFaces[uVar19].mNumIndices = 3;
      lVar18 = 0;
      do {
        paVar4->mFaces[uVar19].mIndices[lVar18] = (uint)(uVar16 + lVar18);
        aVar12 = paVar13[lVar18 + 1];
        if ((uint)pcHeader->num_verts <= (uint)aVar12) {
          aVar12 = (ai_real)(pcHeader->num_verts - 1);
          this_01 = DefaultLogger::get();
          Logger::warn(this_01,"Index overflow in Q1-MDL vertex list.");
        }
        paVar5 = paVar4->mVertices;
        uVar10 = uVar16 + lVar18 & 0xffffffff;
        uVar14 = (ulong)(uint)aVar12;
        fVar20 = (float)*(byte *)(paVar15 + uVar14 + 6) * pcHeader->scale[0];
        paVar5[uVar10].x = fVar20;
        paVar5[uVar10].x = fVar20 + pcHeader->translate[0];
        fVar20 = (float)*(byte *)((long)paVar15 + uVar14 * 4 + 0x19) * pcHeader->scale[1];
        paVar5[uVar10].y = fVar20;
        paVar5[uVar10].y = fVar20 + pcHeader->translate[1];
        fVar20 = (float)*(byte *)((long)paVar15 + uVar14 * 4 + 0x1a) * pcHeader->scale[2];
        paVar5[uVar10].z = fVar20;
        paVar5[uVar10].z = fVar20 + pcHeader->translate[2];
        MD2::LookupNormalIndex
                  (*(uint8_t *)((long)paVar15 + uVar14 * 4 + 0x1b),paVar4->mNormals + uVar10);
        fVar20 = (float)(int)pHVar17->scale[uVar14 * 3 + -1];
        aVar12 = pHVar17->scale[uVar14 * 3];
        if ((*paVar13 == 0.0) && (pHVar17->scale[uVar14 * 3 + -2] != 0.0)) {
          fVar20 = fVar20 + (float)pcHeader->skinwidth * 0.5;
        }
        paVar4->mTextureCoords[0][uVar10].x = (fVar20 + 0.5) / (float)pcHeader->skinwidth;
        paVar4->mTextureCoords[0][uVar10].y =
             1.0 - ((float)(int)aVar12 + 0.5) / (float)pcHeader->skinheight;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      uVar11 = (uint)uVar16;
      *paVar4->mFaces[uVar19].mIndices = uVar11 + 2;
      paVar4->mFaces[uVar19].mIndices[1] = uVar11 + 1;
      paVar4->mFaces[uVar19].mIndices[2] = uVar11;
      paVar13 = paVar13 + 4;
      uVar19 = uVar19 + 1;
      uVar16 = (ulong)(uVar11 + 3);
    } while (uVar19 < (uint)pcHeader->num_tris);
  }
  return;
}

Assistant:

void MDLImporter::InternReadFile_Quake1() {
    ai_assert(NULL != pScene);

    BE_NCONST MDL::Header *pcHeader = (BE_NCONST MDL::Header*)this->mBuffer;

#ifdef AI_BUILD_BIG_ENDIAN
    FlipQuakeHeader(pcHeader);
#endif

    ValidateHeader_Quake1(pcHeader);

    // current cursor position in the file
    const unsigned char* szCurrent = (const unsigned char*)(pcHeader+1);

    // need to read all textures
    for ( unsigned int i = 0; i < (unsigned int)pcHeader->num_skins; ++i) {
        union {
            BE_NCONST MDL::Skin* pcSkin;
            BE_NCONST MDL::GroupSkin* pcGroupSkin;
        };
        if (szCurrent + sizeof(MDL::Skin) > this->mBuffer + this->iFileSize) {
            throw DeadlyImportError("[Quake 1 MDL] Unexpected EOF");
        }
        pcSkin = (BE_NCONST MDL::Skin*)szCurrent;

        AI_SWAP4( pcSkin->group );

        // Quake 1 group-skins
        if (1 == pcSkin->group) {
            AI_SWAP4( pcGroupSkin->nb );

            // need to skip multiple images
            const unsigned int iNumImages = (unsigned int)pcGroupSkin->nb;
            szCurrent += sizeof(uint32_t) * 2;

            if (0 != iNumImages) {
                if (!i) {
                    // however, create only one output image (the first)
                    this->CreateTextureARGB8_3DGS_MDL3(szCurrent + iNumImages * sizeof(float));
                }
                // go to the end of the skin section / the beginning of the next skin
                szCurrent += pcHeader->skinheight * pcHeader->skinwidth +
                    sizeof(float) * iNumImages;
            }
        } else {
            szCurrent += sizeof(uint32_t);
            unsigned int iSkip = i ? UINT_MAX : 0;
            CreateTexture_3DGS_MDL4(szCurrent,pcSkin->group,&iSkip);
            szCurrent += iSkip;
        }
    }
    // get a pointer to the texture coordinates
    BE_NCONST MDL::TexCoord* pcTexCoords = (BE_NCONST MDL::TexCoord*)szCurrent;
    szCurrent += sizeof(MDL::TexCoord) * pcHeader->num_verts;

    // get a pointer to the triangles
    BE_NCONST MDL::Triangle* pcTriangles = (BE_NCONST MDL::Triangle*)szCurrent;
    szCurrent += sizeof(MDL::Triangle) * pcHeader->num_tris;
    VALIDATE_FILE_SIZE(szCurrent);

    // now get a pointer to the first frame in the file
    BE_NCONST MDL::Frame* pcFrames = (BE_NCONST MDL::Frame*)szCurrent;
    MDL::SimpleFrame* pcFirstFrame;

    if (0 == pcFrames->type) {
        // get address of single frame
        pcFirstFrame =( MDL::SimpleFrame*) &pcFrames->frame;
    } else {
        // get the first frame in the group
        BE_NCONST MDL::GroupFrame* pcFrames2 = (BE_NCONST MDL::GroupFrame*) pcFrames;
        pcFirstFrame = &(pcFrames2->frames[0]);
    }
    BE_NCONST MDL::Vertex* pcVertices = (BE_NCONST MDL::Vertex*) ((pcFirstFrame->name) + sizeof(pcFirstFrame->name));
    VALIDATE_FILE_SIZE((const unsigned char*)(pcVertices + pcHeader->num_verts));

#ifdef AI_BUILD_BIG_ENDIAN
    for (int i = 0; i<pcHeader->num_verts;++i)
    {
        AI_SWAP4( pcTexCoords[i].onseam );
        AI_SWAP4( pcTexCoords[i].s );
        AI_SWAP4( pcTexCoords[i].t );
    }

    for (int i = 0; i<pcHeader->num_tris;++i)
    {
        AI_SWAP4( pcTriangles[i].facesfront);
        AI_SWAP4( pcTriangles[i].vertex[0]);
        AI_SWAP4( pcTriangles[i].vertex[1]);
        AI_SWAP4( pcTriangles[i].vertex[2]);
    }
#endif

    // setup materials
    SetupMaterialProperties_3DGS_MDL5_Quake1();

    // allocate enough storage to hold all vertices and triangles
    aiMesh* pcMesh = new aiMesh();

    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
    pcMesh->mNumVertices = pcHeader->num_tris * 3;
    pcMesh->mNumFaces = pcHeader->num_tris;
    pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
    pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mNumUVComponents[0] = 2;

    // there won't be more than one mesh inside the file
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    pScene->mMeshes[0] = pcMesh;

    // now iterate through all triangles
    unsigned int iCurrent = 0;
    for (unsigned int i = 0; i < (unsigned int) pcHeader->num_tris;++i)
    {
        pcMesh->mFaces[i].mIndices = new unsigned int[3];
        pcMesh->mFaces[i].mNumIndices = 3;

        unsigned int iTemp = iCurrent;
        for (unsigned int c = 0; c < 3;++c,++iCurrent)
        {
            pcMesh->mFaces[i].mIndices[c] = iCurrent;

            // read vertices
            unsigned int iIndex = pcTriangles->vertex[c];
            if (iIndex >= (unsigned int)pcHeader->num_verts)
            {
                iIndex = pcHeader->num_verts-1;
                ASSIMP_LOG_WARN("Index overflow in Q1-MDL vertex list.");
            }

            aiVector3D& vec = pcMesh->mVertices[iCurrent];
            vec.x = (float)pcVertices[iIndex].v[0] * pcHeader->scale[0];
            vec.x += pcHeader->translate[0];

            vec.y = (float)pcVertices[iIndex].v[1] * pcHeader->scale[1];
            vec.y += pcHeader->translate[1];
            //vec.y *= -1.0f;

            vec.z = (float)pcVertices[iIndex].v[2] * pcHeader->scale[2];
            vec.z += pcHeader->translate[2];

            // read the normal vector from the precalculated normal table
            MD2::LookupNormalIndex(pcVertices[iIndex].normalIndex,pcMesh->mNormals[iCurrent]);
            //pcMesh->mNormals[iCurrent].y *= -1.0f;

            // read texture coordinates
            float s = (float)pcTexCoords[iIndex].s;
            float t = (float)pcTexCoords[iIndex].t;

            // translate texture coordinates
            if (0 == pcTriangles->facesfront && 0 != pcTexCoords[iIndex].onseam)    {
                s += pcHeader->skinwidth * 0.5f;
            }

            // Scale s and t to range from 0.0 to 1.0
            pcMesh->mTextureCoords[0][iCurrent].x = (s + 0.5f) / pcHeader->skinwidth;
            pcMesh->mTextureCoords[0][iCurrent].y = 1.0f-(t + 0.5f) / pcHeader->skinheight;

        }
        pcMesh->mFaces[i].mIndices[0] = iTemp+2;
        pcMesh->mFaces[i].mIndices[1] = iTemp+1;
        pcMesh->mFaces[i].mIndices[2] = iTemp+0;
        pcTriangles++;
    }
    return;
}